

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

int anon_unknown.dwarf_29391b::WindowsImplX11Impl::checkEvent
              (Display *param_1,XEvent *event,XPointer userData)

{
  uint uVar1;
  int iVar2;
  Atom AVar3;
  allocator local_31;
  string local_30;
  
  if ((XPointer)(event->xany).window == userData) {
    uVar1 = 1;
  }
  else {
    uVar1 = 0;
    if (event->type == 0x21) {
      if ((anonymous_namespace)::WindowsImplX11Impl::checkEvent(_XDisplay*,_XEvent*,char*)::
          wmProtocols == '\0') {
        iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::WindowsImplX11Impl::
                                     checkEvent(_XDisplay*,_XEvent*,char*)::wmProtocols);
        if (iVar2 != 0) {
          std::__cxx11::string::string((string *)&local_30,"WM_PROTOCOLS",&local_31);
          AVar3 = sf::priv::getAtom(&local_30,false);
          std::__cxx11::string::~string((string *)&local_30);
          checkEvent::wmProtocols = AVar3;
          __cxa_guard_release(&(anonymous_namespace)::WindowsImplX11Impl::
                               checkEvent(_XDisplay*,_XEvent*,char*)::wmProtocols);
        }
      }
      uVar1 = (uint)((event->xkey).root != checkEvent::wmProtocols);
    }
  }
  return uVar1;
}

Assistant:

Bool checkEvent(::Display*, XEvent* event, XPointer userData)
        {
            if (event->xany.window == reinterpret_cast<::Window>(userData))
            {
                // The event matches the current window so pick it up
                return true;
            }
            if (event->type == ClientMessage)
            {
                // The input method sometimes sends ClientMessage with a different window ID.
                // Our event loop has to process them for the IM to work.
                // We assume ClientMessage events not having WM_PROTOCOLS message type are such events.
                // ClientMessage events having WM_PROTOCOLS message type should be handled by their own window,
                // so we ignore them here. They will eventually be picked up with the first condition.
                static const Atom wmProtocols = sf::priv::getAtom("WM_PROTOCOLS");
                return event->xclient.message_type != wmProtocols;
            }
            return false;
        }